

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUSSEImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUSSEImpl<double,_1,_1>::calcPartialsPartials
          (BeagleCPUSSEImpl<double,_1,_1> *this,double *destP,double *partials1,double *matrices1,
          double *partials2,double *matrices2,int startPattern,int endPattern)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int local_1c0;
  int local_1bc;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double dStack_1a0;
  int local_18c;
  int local_188;
  int local_184;
  double *local_180;
  int local_174;
  int local_170;
  double local_d8;
  double local_b8;
  int pad;
  int j;
  V_Real sum2_vecA;
  V_Real sum1_vecA;
  int i;
  int w;
  int k;
  double *destPu;
  int v;
  int l;
  int stateCountMinusOne;
  double *matrices2_local;
  double *partials2_local;
  double *matrices1_local;
  double *partials1_local;
  
  iVar1 = (this->super_BeagleCPUImpl<double,_1,_1>).kPartialsPaddedStateCount;
  for (local_170 = 0; local_170 < (this->super_BeagleCPUImpl<double,_1,_1>).kCategoryCount;
      local_170 = local_170 + 1) {
    local_174 = local_170 * (this->super_BeagleCPUImpl<double,_1,_1>).kPartialsPaddedStateCount *
                (this->super_BeagleCPUImpl<double,_1,_1>).kPatternCount +
                (this->super_BeagleCPUImpl<double,_1,_1>).kPartialsPaddedStateCount * startPattern;
    local_180 = destP + local_174;
    for (local_184 = startPattern; local_184 < endPattern; local_184 = local_184 + 1) {
      local_188 = local_170 * (this->super_BeagleCPUImpl<double,_1,_1>).kMatrixSize;
      for (local_18c = 0; local_18c < (this->super_BeagleCPUImpl<double,_1,_1>).kStateCount;
          local_18c = local_18c + 1) {
        local_1a8 = 0.0;
        dStack_1a0 = 0.0;
        local_1b8 = 0.0;
        dStack_1b0 = 0.0;
        for (local_1bc = 0; local_1bc < iVar1 + -1; local_1bc = local_1bc + 2) {
          local_1a8 = matrices1[(long)local_188 + (long)local_1bc] *
                      partials1[(long)local_174 + (long)local_1bc] + local_1a8;
          dStack_1a0 = (matrices1 + (long)local_188 + (long)local_1bc)[1] *
                       (partials1 + (long)local_174 + (long)local_1bc)[1] + dStack_1a0;
          local_1b8 = matrices2[(long)local_188 + (long)local_1bc] *
                      partials2[(long)local_174 + (long)local_1bc] + local_1b8;
          dStack_1b0 = (matrices2 + (long)local_188 + (long)local_1bc)[1] *
                       (partials2 + (long)local_174 + (long)local_1bc)[1] + dStack_1b0;
        }
        auVar3._8_8_ = dStack_1a0;
        auVar3._0_8_ = local_1a8;
        auVar2 = vpermilpd_avx(auVar3,1);
        local_b8 = auVar2._0_8_;
        auVar2._8_8_ = dStack_1b0;
        auVar2._0_8_ = local_1b8;
        auVar2 = vpermilpd_avx(auVar2,1);
        local_d8 = auVar2._0_8_;
        local_188 = (this->super_BeagleCPUImpl<double,_1,_1>).kStateCount + 1 + local_188;
        *local_180 = (local_1a8 + local_b8) * (local_1b8 + local_d8);
        local_180 = local_180 + 1;
      }
      for (local_1c0 = 0; local_1c0 < 1; local_1c0 = local_1c0 + 1) {
        *local_180 = 0.0;
        local_180 = local_180 + 1;
      }
      local_174 = (this->super_BeagleCPUImpl<double,_1,_1>).kPartialsPaddedStateCount + local_174;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_SSE_TEMPLATE
void BeagleCPUSSEImpl<BEAGLE_CPU_SSE_DOUBLE>::calcPartialsPartials(double* __restrict destP,
                                                                   const double* __restrict partials1,
                                                                   const double* __restrict matrices1,
                                                                   const double* __restrict partials2,
                                                                   const double* __restrict matrices2,
                                                                   int startPattern,
                                                                   int endPattern) {
    int stateCountMinusOne = kPartialsPaddedStateCount - 1;
#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
    	int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
    	double* destPu = destP + v;
        for (int k = startPattern; k < endPattern; k++) {
            int w = l * kMatrixSize;
            for (int i = 0; i < kStateCount;
#ifdef DOUBLE_UNROLL
            		i += 2 // TODO This only works if stateCount is even
#else
            		++i
#endif
            ) {
            	V_Real sum1_vecA = VEC_SETZERO();
            	V_Real sum2_vecA = VEC_SETZERO();
            	for (int j = 0; j < stateCountMinusOne; j += 2) {
            		sum1_vecA = VEC_MADD(
								 VEC_LOAD(matrices1 + w + j),  // TODO This only works if w is even
								 VEC_LOAD(partials1 + v + j),  // TODO This only works if v is even
								 sum1_vecA);
            		sum2_vecA = VEC_MADD(
								 VEC_LOAD(matrices2 + w + j),
								 VEC_LOAD(partials2 + v + j),
								 sum2_vecA);
            	}

            	sum1_vecA = VEC_MULT(
            	               VEC_ADD(sum1_vecA, VEC_SWAP(sum1_vecA)),
            	               VEC_ADD(sum2_vecA, VEC_SWAP(sum2_vecA))
            	           );

                // increment for the extra column at the end
                w += kStateCount + T_PAD;

#ifndef DOUBLE_UNROLL
                // Store single value
                VEC_STORE_SCALAR(destPu, sum1_vecA);
                destPu++;
#endif

#ifdef DOUBLE_UNROLL
            	V_Real sum1_vecB = VEC_SETZERO();
            	V_Real sum2_vecB = VEC_SETZERO();
            	for (int j = 0; j < stateCountMinusOne; j += 2) {
            		sum1_vecB = VEC_MADD(
								 VEC_LOAD(matrices1 + w + j),  // TODO This only works if w is even
								 VEC_LOAD(partials1 + v + j),  // TODO This only works if v is even
								 sum1_vecB);
            		sum2_vecB = VEC_MADD(
								 VEC_LOAD(matrices2 + w + j),
								 VEC_LOAD(partials2 + v + j),
								 sum2_vecB);
            	}

            	sum1_vecB = VEC_MULT(
            	               VEC_ADD(sum1_vecB, VEC_SWAP(sum1_vecB)),
            	               VEC_ADD(sum2_vecB, VEC_SWAP(sum2_vecB))
            	           );

                // increment for the extra column at the end
                w += kStateCount + T_PAD;

                // Store both partials in one transaction
                VEC_STORE(destPu, VEC_MOVE(sum1_vecA, sum1_vecB));
                destPu += 2;
#endif

            }
            if (P_PAD) {
                for (int pad = 0; pad < P_PAD; pad++)  {
                    *(destPu++) = 0.0;
                }
            }
            v += kPartialsPaddedStateCount;
        }
    }
}